

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZMaterialData *data)

{
  int *piVar1;
  pair<int,_long> *ppVar2;
  int iVar3;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar4;
  int i_2;
  long lVar5;
  int i;
  long lVar6;
  int i_1;
  ulong uVar7;
  long lVar8;
  TPZManVector<long,_3> ids;
  TPZVec<int> local_d8;
  int aiStack_b8 [4];
  TPZVec<long> local_a8;
  long local_88 [3];
  TPZVec<int> local_70;
  int aiStack_50 [8];
  
  TPZVec<long>::TPZVec(&local_a8,0);
  local_a8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b688;
  local_a8.fStore = local_88;
  local_a8.fNElements = 3;
  local_a8.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_70,0);
  local_70.fStore = aiStack_50;
  local_70._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018f8520;
  local_70.fNElements = 4;
  local_70.fNAlloc = 0;
  aiStack_50[0] = 0;
  aiStack_50[1] = 0;
  aiStack_50[2] = 0;
  aiStack_50[3] = 0;
  TPZVec<int>::TPZVec(&local_d8,0);
  local_d8.fStore = aiStack_b8;
  local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_d8.fNElements = 3;
  local_d8.fNAlloc = 0;
  aiStack_b8[0] = 0;
  aiStack_b8[1] = 0;
  aiStack_b8[2] = 0;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar6 = 0;
  do {
    pTVar4 = TPZGeoEl::NodePtr(this_00,(int)lVar6);
    local_a8.fStore[lVar6] = (long)pTVar4->fId;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  uVar7 = 0;
  do {
    lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar7 & 0xffffffff);
    local_70.fStore[uVar7] = (uint)*(byte *)(lVar6 + 0x14);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 4);
  piVar1 = (this->fSideOrient).super_TPZVec<int>.fStore;
  lVar6 = 0;
  do {
    local_d8.fStore[lVar6] = piVar1[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (this->fhdivfam == EHDivStandard) {
    TPZShapeHDiv<pzshape::TPZShapeTriang>::Initialize
              (&local_a8,&local_70,&local_d8,&data->super_TPZShapeData);
    iVar3 = TPZShapeHDiv<pzshape::TPZShapeTriang>::NShapeF(&data->super_TPZShapeData);
  }
  else {
    iVar3 = 0;
    if (this->fhdivfam == EHDivConstant) {
      TPZShapeHDivConstant<pzshape::TPZShapeTriang>::Initialize
                (&local_a8,&local_70,&local_d8,&data->super_TPZShapeData);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 600))(this);
    }
  }
  lVar6 = (long)iVar3;
  TPZFMatrix<double>::Resize(&(data->phi).super_TPZFMatrix<double>,lVar6,1);
  TPZManVector<std::pair<int,_long>,_20>::Resize(&data->fVecShapeIndex,lVar6);
  if (0 < iVar3) {
    lVar5 = 8;
    lVar8 = 0;
    do {
      if (((data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar8) ||
         ((data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (data->phi).super_TPZFMatrix<double>.fElem[lVar8] = 1.0;
      ppVar2 = (data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
      *(int *)((long)ppVar2 + lVar5 + -8) = (int)lVar8;
      *(long *)((long)&ppVar2->first + lVar5) = lVar8;
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 != lVar8);
  }
  (data->super_TPZShapeData).fShapeType = EVecShape;
  if (local_d8.fStore != aiStack_b8) {
    local_d8.fNAlloc = 0;
    local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_d8.fStore != (int *)0x0) {
      operator_delete__(local_d8.fStore);
    }
  }
  if (local_70.fStore != aiStack_50) {
    local_70.fNAlloc = 0;
    local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_70.fStore != (int *)0x0) {
      operator_delete__(local_70.fStore);
    }
  }
  if (local_a8.fStore != local_88) {
    local_a8.fNAlloc = 0;
    local_a8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_a8.fStore != (long *)0x0) {
      operator_delete__(local_a8.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}